

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.h
# Opt level: O0

void __thiscall
absl::lts_20240722::SubstituteAndAppend
          (lts_20240722 *this,Nonnull<std::string_*> output,string_view format,Arg *a0,Arg *a1,
          Arg *a2)

{
  undefined1 local_68 [8];
  string_view args [3];
  Arg *a2_local;
  Arg *a1_local;
  Arg *a0_local;
  Nonnull<std::string_*> output_local;
  string_view format_local;
  
  args[2]._M_str = (char *)a1;
  _local_68 = substitute_internal::Arg::piece((Arg *)format._M_str);
  args._8_16_ = (undefined1  [16])substitute_internal::Arg::piece(a0);
  args._24_16_ = (undefined1  [16])substitute_internal::Arg::piece((Arg *)args[2]._M_str);
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
            (this,output,format._M_len,local_68,3);
  return;
}

Assistant:

inline void SubstituteAndAppend(absl::Nonnull<std::string*> output,
                                absl::string_view format,
                                const substitute_internal::Arg& a0,
                                const substitute_internal::Arg& a1,
                                const substitute_internal::Arg& a2) {
  const absl::string_view args[] = {a0.piece(), a1.piece(), a2.piece()};
  substitute_internal::SubstituteAndAppendArray(output, format, args,
                                                ABSL_ARRAYSIZE(args));
}